

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

int __thiscall ghc::filesystem::remove(filesystem *this,char *__filename)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  
  uVar2 = std::_V2::system_category();
  __filename[0] = '\0';
  __filename[1] = '\0';
  __filename[2] = '\0';
  __filename[3] = '\0';
  *(undefined8 *)(__filename + 8) = uVar2;
  iVar1 = ::remove(*(char **)this);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 == 2) {
      return 0;
    }
    *(int *)__filename = iVar1;
    *(undefined8 *)(__filename + 8) = uVar2;
  }
  else {
    iVar1 = *(int *)__filename;
  }
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

GHC_INLINE bool remove(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
#ifdef GHC_USE_WCHAR_T
    auto cstr = p.c_str();
#else
    std::wstring np = detail::fromUtf8<std::wstring>(p.u8string());
    auto cstr = np.c_str();
#endif
    DWORD attr = GetFileAttributesW(cstr);
    if (attr == INVALID_FILE_ATTRIBUTES) {
        auto error = ::GetLastError();
        if (error == ERROR_FILE_NOT_FOUND || error == ERROR_PATH_NOT_FOUND) {
            return false;
        }
        ec = detail::make_system_error(error);
    }
    else if (attr & FILE_ATTRIBUTE_READONLY) {
        auto new_attr = attr & ~static_cast<DWORD>(FILE_ATTRIBUTE_READONLY);
        if (!SetFileAttributesW(cstr, new_attr)) {
            auto error = ::GetLastError();
            ec = detail::make_system_error(error);
        }
    }
    if (!ec) {
        if (attr & FILE_ATTRIBUTE_DIRECTORY) {
            if (!RemoveDirectoryW(cstr)) {
                ec = detail::make_system_error();
            }
        }
        else {
            if (!DeleteFileW(cstr)) {
                ec = detail::make_system_error();
            }
        }
    }
#else
    if (::remove(p.c_str()) == -1) {
        auto error = errno;
        if (error == ENOENT) {
            return false;
        }
        ec = detail::make_system_error();
    }
#endif
    return ec ? false : true;
}